

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags flags)

{
  bool bVar1;
  ImGuiID popup_flags;
  undefined4 in_EDX;
  byte *in_RSI;
  bool is_open;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000374;
  bool *in_stack_00000378;
  char *in_stack_00000380;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar2;
  float in_stack_ffffffffffffffbc;
  ImVec2 local_3c;
  ImGuiWindow *str_end;
  ImGuiContext *pIVar3;
  undefined4 in_stack_ffffffffffffffe0;
  bool local_1;
  
  str_end = GImGui->CurrentWindow;
  pIVar3 = GImGui;
  popup_flags = ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                                   &GImGui->Initialized,(char *)str_end);
  bVar1 = IsPopupOpen((ImGuiID)str_end,popup_flags);
  if (bVar1) {
    if (((pIVar3->NextWindowData).Flags & 1U) == 0) {
      local_3c = operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           0.0);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffbc,0.5,0.5);
      SetNextWindowPos(&local_3c,4,(ImVec2 *)&stack0xffffffffffffffbc);
    }
    local_1 = Begin(in_stack_00000380,in_stack_00000378,in_stack_00000374);
    uVar2 = (uint)local_1 << 0x18;
    if ((!local_1) || ((in_RSI != (byte *)0x0 && ((*in_RSI & 1) == 0)))) {
      EndPopup();
      if ((uVar2 & 0x1000000) != 0) {
        ClosePopupToLevel((int)((ulong)str_end >> 0x20),SUB81((ulong)str_end >> 0x18,0));
      }
      local_1 = false;
    }
  }
  else {
    ImGuiNextWindowData::ClearFlags(&pIVar3->NextWindowData);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }

    // Center modal windows by default for increased visibility
    // (this won't really last as settings will kick in, and is mostly for backward compatibility. user may do the same themselves)
    // FIXME: Should test for (PosCond & window->SetWindowPosAllowFlags) with the upcoming window.
    if ((g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) == 0)
        SetNextWindowPos(g.IO.DisplaySize * 0.5f, ImGuiCond_FirstUseEver, ImVec2(0.5f, 0.5f));

    flags |= ImGuiWindowFlags_Popup | ImGuiWindowFlags_Modal | ImGuiWindowFlags_NoCollapse;
    const bool is_open = Begin(name, p_open, flags);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        EndPopup();
        if (is_open)
            ClosePopupToLevel(g.BeginPopupStack.Size, true);
        return false;
    }
    return is_open;
}